

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biffread(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  byte bVar2;
  anon_union_8_4_1dda36f5_for_runsv aVar3;
  uchar *__dest;
  runcxdef *prVar4;
  bool bVar5;
  FILE *__stream;
  size_t sVar6;
  char *pcVar7;
  uint *puVar8;
  uint16_t tmp;
  uint siz;
  uint16_t tmp_1;
  byte *pbVar9;
  ulong uVar10;
  char typ;
  runsdef val;
  int bin_mode;
  char buf [32];
  char local_151;
  runsdef local_150;
  int local_13c;
  uint local_138 [64];
  undefined1 local_38;
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,&local_13c);
  if (local_13c == 0) {
    prVar4 = ctx->bifcxrun;
    if ((uint)(*(int *)&prVar4->runcxhtop - *(int *)&prVar4->runcxhp) < 0x203) {
      runhcmp(prVar4,0x202,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    }
    local_150.runstyp = '\x03';
    aVar3 = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
    local_150.runsv = aVar3;
    pcVar7 = fgets((char *)local_138,0x100,__stream);
    if (pcVar7 != (char *)0x0) {
      pbVar9 = (byte *)(aVar3.runsvnum + 2);
      bVar5 = false;
      siz = 0x202;
      do {
        local_38 = 0;
        puVar8 = local_138;
LAB_00213983:
        bVar2 = (byte)*puVar8;
        if (0xc < bVar2) {
          if (bVar2 == 0x5c) {
            pbVar9[0] = 0x5c;
            pbVar9[1] = 0x5c;
            goto LAB_002139c9;
          }
          if (bVar2 == 0xd) goto LAB_002139a7;
LAB_002139ce:
          *pbVar9 = bVar2;
LAB_002139d2:
          puVar8 = (uint *)((long)puVar8 + 1);
          pbVar9 = pbVar9 + 1;
          goto LAB_00213983;
        }
        if (bVar2 == 9) {
          pbVar9[0] = 0x5c;
          pbVar9[1] = 0x74;
LAB_002139c9:
          pbVar9 = pbVar9 + 1;
          goto LAB_002139d2;
        }
        if (bVar2 == 10) {
LAB_002139a7:
          pbVar9[0] = 0x5c;
          pbVar9[1] = 0x6e;
          pbVar9 = pbVar9 + 1;
          bVar5 = true;
          goto LAB_002139d2;
        }
        if (bVar2 != 0) goto LAB_002139ce;
        if (!bVar5) {
          siz = siz + 0x202;
          uVar10 = (long)pbVar9 - (long)local_150.runsv;
          *(short *)local_150.runsv.runsvstr = (short)uVar10;
          prVar4 = ctx->bifcxrun;
          if ((uint)(*(int *)&prVar4->runcxhtop - *(int *)&prVar4->runcxhp) <= siz) {
            runhcmp(prVar4,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
          }
          __dest = ctx->bifcxrun->runcxhp;
          if ((uchar *)local_150.runsv.runsvnum != __dest) {
            memmove(__dest,local_150.runsv.runsvstr,uVar10 & 0xffffffff);
            local_150.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
          }
          pbVar9 = local_150.runsv.runsvstr + (uVar10 & 0xffffffff);
        }
        if (bVar5) {
          *(short *)local_150.runsv.runsvstr = (short)((long)pbVar9 - (long)local_150.runsv);
          ppuVar1 = &ctx->bifcxrun->runcxhp;
          *ppuVar1 = *ppuVar1 + ((long)pbVar9 - (long)local_150.runsv & 0xffffffff);
          runrepush(ctx->bifcxrun,&local_150);
          break;
        }
        pcVar7 = fgets((char *)local_138,0x100,__stream);
      } while (pcVar7 != (char *)0x0);
      if (bVar5) {
        return;
      }
    }
  }
  else {
    sVar6 = fread(&local_151,1,1,__stream);
    if (sVar6 == 1) {
      if (local_151 == '\b') {
        local_150.runstyp = '\b';
        runpush(ctx->bifcxrun,8,&local_150);
        return;
      }
      if (local_151 == '\x03') {
        sVar6 = fread(local_138,2,1,__stream);
        if (sVar6 == 1) {
          prVar4 = ctx->bifcxrun;
          if ((uint)(*(int *)&prVar4->runcxhtop - *(int *)&prVar4->runcxhp) <=
              (local_138[0] & 0xffff)) {
            runhcmp(prVar4,local_138[0] & 0xffff,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
          }
          sVar6 = fread(ctx->bifcxrun->runcxhp + 2,(ulong)(ushort)local_138[0] - 2,1,__stream);
          if (sVar6 == 1) {
            *(ushort *)ctx->bifcxrun->runcxhp = (ushort)local_138[0];
            local_150.runstyp = '\x03';
            local_150.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
            ctx->bifcxrun->runcxhp = local_150.runsv.runsvstr + (ushort)local_138[0];
            runrepush(ctx->bifcxrun,&local_150);
            return;
          }
        }
      }
      else if ((local_151 == '\x01') && (sVar6 = fread(local_138,4,1,__stream), sVar6 == 1)) {
        runpnum(ctx->bifcxrun,(long)(int)local_138[0]);
        return;
      }
    }
  }
  runpnil(ctx->bifcxrun);
  return;
}

Assistant:

void biffread(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    ushort    len;
    int       bin_mode;

    /* get the file pointer */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    if (bin_mode)
    {
        /* binary file - read the type byte */
        if (osfrb(fp, &typ, 1))
            goto ret_error;
        
        /* read the data according to the type */
        switch(typ)
        {
        case DAT_NUMBER:
            if (osfrb(fp, buf, 4))
                goto ret_error;
            runpnum(ctx->bifcxrun, osrp4s(buf));
            break;
            
        case DAT_SSTRING:
            /* get the size */
            if (osfrb(fp, buf, 2))
                goto ret_error;
            len = osrp2(buf);
            
            /* reserve space */
            runhres(ctx->bifcxrun, len, 0);
            
            /* read the string into the reserved space */
            if (osfrb(fp, ctx->bifcxrun->runcxhp + 2, len - 2))
                goto ret_error;
            
            /* set up the string */
            oswp2(ctx->bifcxrun->runcxhp, len);
            val.runstyp = DAT_SSTRING;
            val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
            
            /* consume the space */
            ctx->bifcxrun->runcxhp += len;
            
            /* push the value */
            runrepush(ctx->bifcxrun, &val);
            break;
            
        case DAT_TRUE:
            val.runstyp = DAT_TRUE;
            runpush(ctx->bifcxrun, DAT_TRUE, &val);
            break;
            
        default:
            goto ret_error;
        }
    }
    else
    {
        uchar  buf[257];
        uchar *dst;
        uchar *src;
        uint   len;
        uint   res_total;
        int    found_nl;

        /* 
         *   reserve some space in the heap - we'll initially reserve
         *   space for twice our buffer, in case every single character
         *   needs to be expanded into an escape sequence
         */
        res_total = sizeof(buf) * 2;
        runhres(ctx->bifcxrun, res_total, 0);

        /* set up our output value */
        val.runstyp = DAT_SSTRING;
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        dst = ctx->bifcxrun->runcxhp + 2;

        /* keep going until we find a newline or run out of data */
        for (found_nl = FALSE ; !found_nl ; )
        {
            /* text-mode - read the result into our buffer */
            if (!osfgets((char *)buf, sizeof(buf) - 1, fp))
            {
                /* 
                 *   if we found a newline, return what we have;
                 *   otherwise, return an error 
                 */
                if (found_nl)
                    break;
                else
                    goto ret_error;
            }
            
            /* 
             *   make sure it's null-terminated, in case the buffer was
             *   full 
             */
            buf[256] = '\0';
            
            /* translate into the heap area we've reserved */
            for (src = buf ; *src != '\0' ; ++src, ++dst)
            {
                /* determine if we need translations */
                switch(*src)
                {
                case '\n':
                case '\r':
                    /* translate to a newline sequence */
                    *dst++ = '\\';
                    *dst = 'n';
                    
                    /* note that we've found our newline */
                    found_nl = TRUE;
                    break;
                    
                case '\t':
                    /* translate to a tab sequence */
                    *dst++ = '\\';
                    *dst = 't';
                    break;
                    
                case '\\':
                    /* expand to a double-backslash sequence */
                    *dst++ = '\\';
                    *dst = '\\';
                    break;

                default:
                    /* leave other characters intact */
                    *dst = *src;
                    break;
                }
            }

            /*
             *   If we didn't find the newline, we'll need more space.
             *   This is a bit tricky, because the space we've already set
             *   up may move if we compact the heap while asking for more
             *   space.  So, remember our current length, reserve another
             *   buffer-full of space, and set everything up at the new
             *   output location if necessary.  
             */
            if (!found_nl)
            {
                /* reserve another buffer-full (double for expansion) */
                res_total += sizeof(buf) * 2;

                /* note our current offset */
                len = dst - val.runsv.runsvstr;
                oswp2(val.runsv.runsvstr, len);

                /* ask for the space */
                runhres(ctx->bifcxrun, res_total, 0);

                /* 
                 *   Since we were at the top of the heap before, we
                 *   should still be at the top of the heap.  If not,
                 *   we'll have to copy from our old location to the new
                 *   top of the heap.  
                 */
                if (val.runsv.runsvstr != ctx->bifcxrun->runcxhp)
                {
                    /* copy our existing text to our new location */
                    memmove(ctx->bifcxrun->runcxhp, val.runsv.runsvstr, len);

                    /* fix up our pointer */
                    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
                }

                /* re-establish our output pointer at our new location */
                dst = val.runsv.runsvstr + len;
            }
        }

        /* finish setting up the string */
        len = dst - val.runsv.runsvstr;
        oswp2(val.runsv.runsvstr, len);

        /* consume the space */
        ctx->bifcxrun->runcxhp += len;

        /* push the value */
        runrepush(ctx->bifcxrun, &val);
    }

    /* success - we've already pushed the return value */
    return;

ret_error:
    runpnil(ctx->bifcxrun);
}